

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_memory_editor.h
# Opt level: O2

char * __thiscall MemoryEditor::FormatBinary(MemoryEditor *this,uint8_t *buf,int width)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  
  if (0x40 < width) {
    __assert_fail("width <= 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui_memory_editor/imgui_memory_editor.h"
                  ,0x270,"const char *MemoryEditor::FormatBinary(const uint8_t *, int) const");
  }
  uVar1 = (long)width / 8 & 0xffffffff;
  uVar2 = 0;
  while (0 < (int)uVar1) {
    uVar1 = uVar1 - 1;
    for (uVar3 = 7; uVar3 != 0xffffffff; uVar3 = uVar3 - 1) {
      FormatBinary::out_buf[uVar2] = (buf[uVar1] >> (uVar3 & 0x1f) & 1) == 0 ^ 0x31;
      uVar2 = uVar2 + 1;
    }
    FormatBinary::out_buf[uVar2] = ' ';
    uVar2 = uVar2 + 1;
  }
  if (uVar2 < 0x49) {
    FormatBinary::out_buf[uVar2] = '\0';
    return FormatBinary::out_buf;
  }
  __assert_fail("out_n < ((int)(sizeof(out_buf) / sizeof(*(out_buf))))",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui_memory_editor/imgui_memory_editor.h"
                ,0x27a,"const char *MemoryEditor::FormatBinary(const uint8_t *, int) const");
}

Assistant:

const char* FormatBinary(const uint8_t* buf, int width) const
    {
        IM_ASSERT(width <= 64);
        size_t out_n = 0;
        static char out_buf[64 + 8 + 1];
        int n = width / 8;
        for (int j = n - 1; j >= 0; --j)
        {
            for (int i = 0; i < 8; ++i)
                out_buf[out_n++] = (buf[j] & (1 << (7 - i))) ? '1' : '0';
            out_buf[out_n++] = ' ';
        }
        IM_ASSERT(out_n < IM_ARRAYSIZE(out_buf));
        out_buf[out_n] = 0;
        return out_buf;
    }